

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  unsigned_long uVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  char *pcVar4;
  char **ppcVar5;
  size_t insize;
  char **ppcVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  char *authorization;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  uVar1 = authstatus->picked;
  if (uVar1 == 0x80 && !proxy) {
    CVar3 = Curl_output_aws_sigv4(data);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar9 = "AWS_SIGV4";
    goto LAB_00136c5f;
  }
  if (uVar1 != 1) {
    if (uVar1 == 2) {
      CVar3 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar9 = "Digest";
    }
    else if (uVar1 == 8) {
      CVar3 = Curl_output_ntlm(data,proxy);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar9 = "NTLM";
    }
    else {
      pcVar9 = (char *)0x0;
    }
    goto LAB_00136c5f;
  }
  if (proxy) {
    if ((((ulong)conn->bits & 4) == 0) ||
       (pcVar9 = Curl_checkProxyheaders(data,conn,"Proxy-authorization",0x13), pcVar9 != (char *)0x0
       )) {
      if (!proxy) goto LAB_00136c2c;
      goto LAB_00136c53;
    }
LAB_00136d7e:
    local_38 = 0;
    local_48 = (char *)0x0;
    lVar8 = 0x1358;
    ppcVar5 = &(data->state).aptr.user;
    if (proxy) {
      lVar8 = 0x13a0;
      ppcVar5 = &(data->state).aptr.proxyuser;
    }
    ppcVar6 = &(data->state).aptr.proxypasswd;
    if (!proxy) {
      ppcVar6 = &(data->state).aptr.passwd;
    }
    pcVar9 = *ppcVar5;
    pcVar4 = "";
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    pcVar7 = *ppcVar6;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    pcVar9 = curl_maprintf("%s:%s",pcVar9,pcVar7);
    if (pcVar9 == (char *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      local_40 = lVar8;
      insize = strlen(pcVar9);
      CVar3 = Curl_base64_encode(pcVar9,insize,&local_48,&local_38);
      lVar8 = local_40;
      if (CVar3 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar3 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((long)&data->magic + local_40));
          if (proxy) {
            pcVar4 = "Proxy-";
          }
          pcVar4 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar4,local_48);
          *(char **)((long)&data->magic + lVar8) = pcVar4;
          (*Curl_cfree)(local_48);
          CVar3 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)&data->magic + lVar8) != 0) {
            CVar3 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar9);
    }
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar9 = "Basic";
  }
  else {
LAB_00136c2c:
    if (((data->state).aptr.user != (char *)0x0) &&
       (pcVar9 = Curl_checkheaders(data,"Authorization",0xd), pcVar9 == (char *)0x0))
    goto LAB_00136d7e;
LAB_00136c53:
    pcVar9 = (char *)0x0;
  }
  authstatus->field_0x18 = authstatus->field_0x18 | 1;
LAB_00136c5f:
  if (authstatus->picked == 0x40) {
    if (((!proxy) && ((data->set).str[0x3c] != (char *)0x0)) &&
       (pcVar4 = Curl_checkheaders(data,"Authorization",0xd), pcVar4 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.userpwd);
      pcVar9 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x3c]);
      (data->state).aptr.userpwd = pcVar9;
      if (pcVar9 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar9 = "Bearer";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  if (pcVar9 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      pcVar4 = "Server";
      if (proxy) {
        pcVar4 = "Proxy";
      }
      ppcVar5 = &(data->state).aptr.user;
      if (proxy) {
        ppcVar5 = &(data->state).aptr.proxyuser;
      }
      pcVar7 = "";
      if (*ppcVar5 != (char *)0x0) {
        pcVar7 = *ppcVar5;
      }
      Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar4,pcVar9,pcVar7);
    }
    authstatus->field_0x18 =
         (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
  (void)conn;

#ifdef CURL_DISABLE_DIGEST_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_AWS
  if((authstatus->picked == CURLAUTH_AWS_SIGV4) && !proxy) {
    /* this method is never for proxy */
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, STRCONST("Proxy-authorization"))) ||
#endif
      (!proxy && data->state.aptr.user &&
       !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    (void)proxy;
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = !authstatus->done;
  }
  else
    authstatus->multipass = FALSE;

  return result;
}